

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::PropagateIntRangeBinary
          (GlobOpt *this,Instr *instr,int32 min1,int32 max1,int32 min2,int32 max2,int32 *pNewMin,
          int32 *pNewMax)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  IntConstantBounds IVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  undefined4 *puVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  IntConstantBounds local_48;
  uint local_40;
  uint local_3c;
  IntConstantBounds local_38;
  
  uVar14 = 0x80000000;
  uVar15 = 0x7fffffff;
  switch(instr->m_opcode) {
  case And_A:
    if (min2 != -0x80000000 || min1 != -0x80000000) {
      uVar14 = max1;
      if ((uint)max1 < (uint)min1) {
        uVar14 = min1;
      }
      uVar15 = max2;
      if ((uint)max2 < (uint)min2) {
        uVar15 = min2;
      }
      if (uVar14 < uVar15) {
        min2 = min1;
        max2 = max1;
      }
      if ((uint)max2 < (uint)min2) {
        max2 = min2;
      }
      if (0x7ffffffe < (uint)max2) {
        max2 = 0x7fffffff;
      }
      uVar15 = max2;
      uVar14 = min2 & 0x80000000;
    }
    break;
  case Or_A:
  case Xor_A:
    if ((uint)max1 < (uint)min1) {
      max1 = min1;
    }
    if ((uint)max2 < (uint)min2) {
      max2 = min2;
    }
    if ((uint)max2 < (uint)max1) {
      max2 = max1;
    }
    if (max2 < 0) break;
    iVar16 = 0x1f;
    if (max2 != 0) {
      for (; (uint)max2 >> iVar16 == 0; iVar16 = iVar16 + -1) {
      }
    }
    uVar15 = 1;
    if (1 < (uint)max2) {
      uVar15 = (2 << ((byte)iVar16 & 0x1f)) - 1;
    }
    goto LAB_004537ff;
  case Shl_A:
    bVar5 = 0x1f < (uint)(max2 | min2);
    uVar13 = max2 & 0x1f;
    if (bVar5 && min2 != max2) {
      uVar13 = 0x1f;
    }
    uVar7 = 0;
    if (!bVar5 || min2 == max2) {
      uVar7 = min2 & 0x1f;
    }
    uVar11 = 0x1f;
    if (min1 != 0) {
      for (; (uint)min1 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar2 = uVar11 ^ 0x1f;
    if (min1 == 1) {
      uVar2 = 0x1f;
    }
    uVar1 = 0x1f;
    if (max1 != 0) {
      for (; (uint)max1 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar12 = 0x1f;
    if (max1 != 1) {
      uVar12 = uVar1 ^ 0x1f;
    }
    if ((uVar2 <= uVar13 && min1 != 0) || (max1 != 0 && uVar12 <= uVar13)) break;
    iVar16 = (2 << (~(byte)(uVar11 ^ 0x1f) & 0x1f)) + -1;
    if (min1 == 1) {
      iVar16 = min1;
    }
    if (min1 == 0) {
      iVar16 = min1;
    }
    if (max1 == 0) {
      uVar14 = 0;
LAB_00453d48:
      uVar15 = uVar14 << (sbyte)uVar7 & 0x7fffffff;
    }
    else {
      uVar14 = (2 << (~(byte)(uVar1 ^ 0x1f) & 0x1f)) - 1;
      if (max1 != 1) {
        max1 = uVar14;
      }
      if (max1 < 1) goto LAB_00453d48;
      uVar11 = 0x1e;
      if (uVar13 < 0x1e) {
        uVar11 = uVar13;
      }
      if (max1 == 1) {
LAB_004538e0:
        uVar11 = max1 << (sbyte)uVar11 & 0x7fffffff;
        uVar15 = iVar16 << (sbyte)uVar7 & 0x7fffffff;
        uVar14 = max1;
        if (uVar15 < uVar11) {
          uVar15 = uVar11;
        }
      }
      else {
        uVar2 = 0x1f;
        if (max1 != 0) {
          for (; (uint)max1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        if (uVar11 <= ~uVar2 + 0x21) goto LAB_004538e0;
      }
    }
    uVar14 = uVar14 << (sbyte)uVar13;
    if (iVar16 < 0) {
      uVar7 = uVar13;
    }
    uVar13 = iVar16 << (sbyte)uVar7;
    if ((int)uVar14 <= (int)uVar13) {
      uVar13 = uVar14;
    }
    if (uVar13 != 0) {
      iVar16 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> iVar16 == 0; iVar16 = iVar16 + -1) {
        }
      }
      uVar14 = 1 << ((byte)iVar16 & 0x1f);
      if (uVar13 == 1) {
        uVar14 = 1;
      }
      break;
    }
LAB_004537ff:
    uVar14 = 0;
    break;
  case Shr_A:
    bVar5 = (uint)(max2 | min2) < 0x20;
    bVar10 = 0x1f;
    if (bVar5 || min2 == max2) {
      bVar10 = (byte)max2 & 0x1f;
    }
    bVar6 = 0;
    if (bVar5 || min2 == max2) {
      bVar6 = (byte)min2 & 0x1f;
    }
    uVar15 = (uint)max1 >> bVar6;
    if (max1 < 0) {
      uVar15 = max1 >> bVar10;
    }
    if (min1 < 0) {
      uVar14 = min1 >> bVar6;
    }
    else {
      uVar14 = (uint)min1 >> bVar10;
    }
    break;
  case ShrU_A:
    if ((max2 & 0x1fU) == 0 && min2 == max2) {
      uVar15 = max1;
      uVar14 = min1;
      if ((min1 < 0) && ((*(ushort *)&instr->field_0x36 & 0x80) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1824,"(instr->ignoreIntOverflow || min1 >= 0)",
                           "instr->ignoreIntOverflow || min1 >= 0");
        if (!bVar5) {
LAB_00453d88:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
    }
    else {
      IntConstantBounds::IntConstantBounds(&local_48,min2,max2);
      local_38 = IntConstantBounds::And_0x1f(&local_48);
      if (((min1 < 0) && ((instr->field_0x36 & 0x80) == 0)) &&
         (-1 < (long)local_38 && local_38.lowerBound < 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x182d,
                           "(min1 >= 0 || instr->ignoreIntOverflow || !src2NewBounds.Contains(0))",
                           "min1 >= 0 || instr->ignoreIntOverflow || !src2NewBounds.Contains(0)");
        if (!bVar5) goto LAB_00453d88;
        *puVar9 = 0;
      }
      IVar4 = local_38;
      iVar16 = local_38.upperBound;
      if (iVar16 < local_38.lowerBound) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1831,"(min2 <= max2)","min2 <= max2");
        if (!bVar5) goto LAB_00453d88;
        *puVar9 = 0;
      }
      iVar8 = local_38.lowerBound;
      if (((iVar8 < 1) && (min1 < 0)) && ((*(ushort *)&instr->field_0x36 & 0x80) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1833,"(min2 > 0 || instr->ignoreIntOverflow || min1 >= 0)",
                           "min2 > 0 || instr->ignoreIntOverflow || min1 >= 0");
        if (!bVar5) goto LAB_00453d88;
        *puVar9 = 0;
        iVar8 = local_38.lowerBound;
      }
      uVar13 = max1;
      if ((uint)min1 < (uint)max1) {
        uVar13 = min1;
      }
      uVar7 = max1;
      if ((uint)max1 < (uint)min1) {
        uVar7 = min1;
      }
      if (iVar8 < 0 || 0x1f < iVar16) {
        AssertCount = AssertCount + 1;
        local_40 = uVar13;
        local_3c = uVar7;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x183f,"(min2 >= 0 && max2 < 32)","min2 >= 0 && max2 < 32");
        if (!bVar5) goto LAB_00453d88;
        *puVar9 = 0;
        iVar8 = local_38.lowerBound;
        uVar13 = local_40;
        uVar7 = local_3c;
      }
      uVar13 = uVar13 >> ((byte)IVar4.upperBound & 0x1f);
      uVar14 = 0;
      if (max1 < 0) {
        uVar14 = uVar13;
      }
      uVar15 = 0xffffffff;
      if (-1 < min1) {
        uVar15 = uVar7;
      }
      if (0 < min1) {
        uVar14 = uVar13;
      }
      uVar15 = uVar15 >> ((byte)iVar8 & 0x1f);
      if (((instr->field_0x36 & 0x80) == 0) && ((int)(uVar14 | uVar15) < 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1855,"(instr->ignoreIntOverflow || (min >= 0 && max >= 0))",
                           "instr->ignoreIntOverflow || (min >= 0 && max >= 0)");
        if (!bVar5) goto LAB_00453d88;
        *puVar9 = 0;
        iVar8 = local_38.lowerBound;
      }
      if ((int)uVar15 < (int)uVar14) {
        if ((iVar8 != 0) || ((min1 < 0 && ((*(ushort *)&instr->field_0x36 & 0x80) == 0)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x1859,"(min2 == 0 && (instr->ignoreIntOverflow || min1 >= 0))",
                             "min2 == 0 && (instr->ignoreIntOverflow || min1 >= 0)");
          if (!bVar5) goto LAB_00453d88;
          *puVar9 = 0;
        }
        uVar15 = 0x7fffffff;
        uVar14 = 0x80000000;
      }
    }
  }
  *pNewMin = uVar14;
  *pNewMax = uVar15;
  return;
}

Assistant:

void
GlobOpt::PropagateIntRangeBinary(IR::Instr *instr, int32 min1, int32 max1,
    int32 min2, int32 max2, int32 *pNewMin, int32* pNewMax)
{
    int32 min, max, tmp, tmp2;

    min = INT32_MIN;
    max = INT32_MAX;

    switch (instr->m_opcode)
    {
    case Js::OpCode::Xor_A:
    case Js::OpCode::Or_A:
        // Find range with highest high order bit
        tmp = ::max((uint32)min1, (uint32)max1);
        tmp2 = ::max((uint32)min2, (uint32)max2);

        if ((uint32)tmp > (uint32)tmp2)
        {
            max = tmp;
        }
        else
        {
            max = tmp2;
        }

        if (max < 0)
        {
            min = INT32_MIN;  // REVIEW: conservative...
            max = INT32_MAX;
        }
        else
        {
            // Turn values like 0x1010 into 0x1111
            max = 1 << Math::Log2(max);
            max = (uint32)(max << 1) - 1;
            min = 0;
        }

        break;

    case Js::OpCode::And_A:

        if (min1 == INT32_MIN && min2 == INT32_MIN)
        {
            // Shortcut
            break;
        }

        // Find range with lowest higher bit
        tmp = ::max((uint32)min1, (uint32)max1);
        tmp2 = ::max((uint32)min2, (uint32)max2);

        if ((uint32)tmp < (uint32)tmp2)
        {
            min = min1;
            max = max1;
        }
        else
        {
            min = min2;
            max = max2;
        }

        // To compute max, look if min has higher high bit
        if ((uint32)min > (uint32)max)
        {
            max = min;
        }

        // If max is negative, max let's assume it could be -1, so result in MAX_INT
        if (max < 0)
        {
            max = INT32_MAX;
        }

        // If min is positive, the resulting min is zero
        if (min >= 0)
        {
            min = 0;
        }
        else
        {
            min = INT32_MIN;
        }
        break;

    case Js::OpCode::Shl_A:
        {
            // Shift count
            if (min2 != max2 && ((uint32)min2 > 0x1F || (uint32)max2 > 0x1F))
            {
                min2 = 0;
                max2 = 0x1F;
            }
            else
            {
                min2 &= 0x1F;
                max2 &= 0x1F;
            }

            int32 min1FreeTopBitCount = min1 ? (sizeof(int32) * 8) - (Math::Log2(min1) + 1) : (sizeof(int32) * 8);
            int32 max1FreeTopBitCount = max1 ? (sizeof(int32) * 8) - (Math::Log2(max1) + 1) : (sizeof(int32) * 8);
            if (min1FreeTopBitCount <= max2 || max1FreeTopBitCount <= max2)
            {
                // If the shift is going to touch the sign bit return the max range
                min = INT32_MIN;
                max = INT32_MAX;
            }
            else
            {
                // Compute max
                // Turn values like 0x1010 into 0x1111
                if (min1)
                {
                    min1 = 1 << Math::Log2(min1);
                    min1 = (min1 << 1) - 1;
                }
                if (max1)
                {
                    max1 = 1 << Math::Log2(max1);
                    max1 = (uint32)(max1 << 1) - 1;
                }

                if (max1 > 0)
                {
                    int32 nrTopBits = (sizeof(int32) * 8) - Math::Log2(max1);
                    if (nrTopBits < ::min(max2, 30))
                        max = INT32_MAX;
                    else
                        max = ::max((max1 << ::min(max2, 30)) & ~0x80000000, (min1 << min2) & ~0x80000000);
                }
                else
                {
                    max = (max1 << min2) & ~0x80000000;
                }
                // Compute min

                if (min1 < 0)
                {
                    min = ::min(min1 << max2, max1 << max2);
                }
                else
                {
                    min = ::min(min1 << min2, max1 << max2);
                }
                // Turn values like 0x1110 into 0x1000
                if (min)
                {
                    min = 1 << Math::Log2(min);
                }
            }
        }
        break;

    case Js::OpCode::Shr_A:
        // Shift count
        if (min2 != max2 && ((uint32)min2 > 0x1F || (uint32)max2 > 0x1F))
        {
            min2 = 0;
            max2 = 0x1F;
        }
        else
        {
            min2 &= 0x1F;
            max2 &= 0x1F;
        }

        // Compute max

        if (max1 < 0)
        {
            max = max1 >> max2;
        }
        else
        {
            max = max1 >> min2;
        }

        // Compute min

        if (min1 < 0)
        {
            min = min1 >> min2;
        }
        else
        {
            min = min1 >> max2;
        }
        break;

    case Js::OpCode::ShrU_A:

        // shift count is constant zero
        if ((min2 == max2) && (max2 & 0x1f) == 0)
        {
            // We can't encode uint32 result, so it has to be used as int32 only or the original value is positive.
            Assert(instr->ignoreIntOverflow || min1 >= 0);
            // We can transfer the signed int32 range.
            min = min1;
            max = max1;
            break;
        }

        const IntConstantBounds src2NewBounds = IntConstantBounds(min2, max2).And_0x1f();
        // Zero is only allowed if result is always a signed int32 or always used as a signed int32
        Assert(min1 >= 0 || instr->ignoreIntOverflow || !src2NewBounds.Contains(0));
        min2 = src2NewBounds.LowerBound();
        max2 = src2NewBounds.UpperBound();

        Assert(min2 <= max2);
        // zero shift count is only allowed if result is used as int32 and/or value is positive
        Assert(min2 > 0 || instr->ignoreIntOverflow || min1 >= 0);

        uint32 umin1 = (uint32)min1;
        uint32 umax1 = (uint32)max1;

        if (umin1 > umax1)
        {
            uint32 temp = umax1;
            umax1 = umin1;
            umin1 = temp;
        }

        Assert(min2 >= 0 && max2 < 32);

        // Compute max

        if (min1 < 0)
        {
            umax1 = UINT32_MAX;
        }
        max = umax1 >> min2;

        // Compute min

        if (min1 <= 0 && max1 >=0)
        {
            min = 0;
        }
        else
        {
            min = umin1 >> max2;
        }

        // We should be able to fit uint32 range as int32
        Assert(instr->ignoreIntOverflow || (min >= 0 && max >= 0) );
        if (min > max)
        {
            // can only happen if shift count can be zero
            Assert(min2 == 0 && (instr->ignoreIntOverflow || min1 >= 0));
            min = Int32ConstMin;
            max = Int32ConstMax;
        }

        break;
    }

    *pNewMin = min;
    *pNewMax = max;
}